

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

cni_holder_base *
cs_impl::cni::construct_helper<cs_impl::any(*)(std::shared_ptr<cs::context_type>const&)>::
_construct<cs_impl::any(&)(std::shared_ptr<cs::context_type>const&),cs_impl::any,std::shared_ptr<cs::context_type>const&>
          (_func_any_shared_ptr<cs::context_type>_ptr *val,
          _func_any_shared_ptr<cs::context_type>_ptr *target_function)

{
  cni_holder_base *pcVar1;
  _func_any_shared_ptr<cs::context_type>_ptr **in_stack_00000008;
  cni_holder<cs_impl::any_(*)(const_std::shared_ptr<cs::context_type>_&),_cs_impl::any_(*)(const_std::shared_ptr<cs::context_type>_&)>
  *in_stack_00000010;
  _func_any_shared_ptr<cs::context_type>_ptr *in_stack_ffffffffffffffc8;
  _func_any_shared_ptr<cs::context_type>_ptr *in_stack_ffffffffffffffd0;
  
  check_conversion<cs_impl::any,cs_impl::any,std::shared_ptr<cs::context_type>const&,std::shared_ptr<cs::context_type>const&>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  pcVar1 = (cni_holder_base *)operator_new(0x28);
  cni_holder<cs_impl::any_(*)(const_std::shared_ptr<cs::context_type>_&),_cs_impl::any_(*)(const_std::shared_ptr<cs::context_type>_&)>
  ::cni_holder(in_stack_00000010,in_stack_00000008);
  return pcVar1;
}

Assistant:

static cni_holder_base *_construct(X &&val, RetT(*target_function)(ArgsT...))
			{
				using source_function_type = typename type_conversion_cpp<RetT>::target_type(*)(
				                                 typename type_conversion_cs<ArgsT>::source_type...);
				// Return type
				static_assert(cni_convertible<RetT, typename type_conversion_cpp<RetT>::target_type>::value,
				              "Invalid conversion.");
				// Argument type
				check_conversion(target_function, source_function_type(nullptr));
				return new cni_holder<T, source_function_type>(std::forward<X>(val));
			}